

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O3

bool __thiscall chatra::Thread::restoreTemporaryLock(Thread *this)

{
  pointer *pppVar1;
  pointer pFVar2;
  bool bVar3;
  undefined1 auVar4 [8];
  undefined1 local_40 [8];
  vector<chatra::Reference,_std::allocator<chatra::Reference>_> temp;
  
  pFVar2 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  Lock::getTemporary((vector<chatra::Reference,_std::allocator<chatra::Reference>_> *)local_40,
                     pFVar2[-1].lock);
  auVar4 = local_40;
  do {
    if (auVar4 == (undefined1  [8])
                  temp.super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
      Lock::temporaryLockRestored(pFVar2[-1].lock);
      pppVar1 = &pFVar2[-1].stack.
                 super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + -1;
      bVar3 = true;
LAB_00161b72:
      if (local_40 != (undefined1  [8])0x0) {
        operator_delete((void *)local_40);
      }
      return bVar3;
    }
    bVar3 = lockReference(this,((pointer)auVar4)->node,Temporary);
    if (!bVar3) {
      bVar3 = false;
      goto LAB_00161b72;
    }
    auVar4 = (undefined1  [8])((long)auVar4 + 8);
  } while( true );
}

Assistant:

bool Thread::restoreTemporaryLock() {
	auto& f = frames.back();
	auto temp = f.lock->getTemporary();
	for (auto ref : temp) {
		if (!lockReference(ref, LockType::Temporary))
			return false;
	}
	f.lock->temporaryLockRestored();
	f.stack.pop_back();
	return true;
}